

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component_icon.cpp
# Opt level: O1

ComponentIcon * lsim::gui::ComponentIcon::cache(uint32_t id,char *data,size_t len)

{
  ComponentIcon *pCVar1;
  ComponentIcon *pCVar2;
  default_delete<lsim::gui::ComponentIcon> *this;
  pointer *__ptr;
  ComponentIcon *local_28;
  uint32_t local_1c;
  
  local_1c = id;
  pCVar2 = (ComponentIcon *)operator_new(0x20);
  ComponentIcon(pCVar2,data,len);
  local_28 = pCVar2;
  this = (default_delete<lsim::gui::ComponentIcon> *)
         std::__detail::
         _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<lsim::gui::ComponentIcon,_std::default_delete<lsim::gui::ComponentIcon>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<lsim::gui::ComponentIcon,_std::default_delete<lsim::gui::ComponentIcon>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
         ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::unique_ptr<lsim::gui::ComponentIcon,_std::default_delete<lsim::gui::ComponentIcon>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<lsim::gui::ComponentIcon,_std::default_delete<lsim::gui::ComponentIcon>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       *)&m_icon_cache,&local_1c);
  pCVar1 = local_28;
  local_28 = (ComponentIcon *)0x0;
  pCVar2 = *(ComponentIcon **)this;
  *(ComponentIcon **)this = pCVar1;
  if (pCVar2 != (ComponentIcon *)0x0) {
    std::default_delete<lsim::gui::ComponentIcon>::operator()(this,pCVar2);
  }
  if (local_28 != (ComponentIcon *)0x0) {
    std::default_delete<lsim::gui::ComponentIcon>::operator()
              ((default_delete<lsim::gui::ComponentIcon> *)&local_28,local_28);
  }
  pCVar2 = cached(local_1c);
  return pCVar2;
}

Assistant:

ComponentIcon* ComponentIcon::cache(uint32_t id, const char* data, size_t len) {
	m_icon_cache[id] = std::make_unique<ComponentIcon>(data, len);
	return cached(id);
}